

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  bool bVar1;
  string *psVar2;
  string *psVar3;
  long lVar4;
  bool bVar5;
  allocator<char> local_f1;
  string lang;
  string objectName;
  string repVar;
  string relFromBinary;
  string relFromSource;
  
  psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  psVar3 = GetCurrentSourceDirectory_abi_cxx11_(this);
  MaybeConvertToRelativePath(&relFromSource,this,psVar3,psVar2);
  if (relFromSource._M_string_length == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xa1e,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&relFromSource);
  psVar3 = GetCurrentBinaryDirectory_abi_cxx11_(this);
  MaybeConvertToRelativePath(&relFromBinary,this,psVar3,psVar2);
  if (relFromBinary._M_string_length == 0) {
    __assert_fail("!relFromBinary.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xa25,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&relFromBinary);
  objectName._M_dataplus._M_p = (pointer)&objectName.field_2;
  objectName._M_string_length = 0;
  objectName.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&objectName);
  bVar1 = cmsys::SystemTools::FileIsFullPath(&objectName);
  if ((bVar1) && (bVar1 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance), bVar1)) {
    psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    cmsys::SystemTools::GetFilenameName(&lang,psVar2);
    std::__cxx11::string::operator=((string *)&objectName,(string *)&lang);
    std::__cxx11::string::~string((string *)&lang);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lang,"KEEP_EXTENSION",(allocator<char> *)&repVar);
  bVar1 = cmSourceFile::GetPropertyAsBool(source,&lang);
  std::__cxx11::string::~string((string *)&lang);
  bVar5 = true;
  if (bVar1) goto LAB_0018f458;
  bVar1 = NeedBackwardsCompatibility_2_4(this);
  if (bVar1) {
LAB_0018f327:
    lVar4 = std::__cxx11::string::rfind((char)&objectName,0x2e);
    if (lVar4 != -1) {
      std::__cxx11::string::substr((ulong)&lang,(ulong)&objectName);
      std::__cxx11::string::operator=((string *)&objectName,(string *)&lang);
      std::__cxx11::string::~string((string *)&lang);
    }
    if (customOutputExtension != (char *)0x0) {
      std::__cxx11::string::append((char *)&objectName);
      bVar5 = false;
      goto LAB_0018f458;
    }
    bVar5 = false;
  }
  else {
    cmSourceFile::GetLanguage_abi_cxx11_(&lang,source);
    if (lang._M_string_length == 0) {
      bVar1 = false;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&repVar,"CMAKE_",&local_f1);
      std::__cxx11::string::append((string *)&repVar);
      std::__cxx11::string::append((char *)&repVar);
      bVar1 = cmMakefile::IsOn(this->Makefile,&repVar);
      std::__cxx11::string::~string((string *)&repVar);
    }
    std::__cxx11::string::~string((string *)&lang);
    if ((customOutputExtension != (char *)0x0) || (bVar5 = true, bVar1 != false)) goto LAB_0018f327;
  }
  cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_(&lang,this->GlobalGenerator,source);
  std::__cxx11::string::append((string *)&objectName);
  std::__cxx11::string::~string((string *)&lang);
LAB_0018f458:
  if (hasSourceExtension != (bool *)0x0) {
    *hasSourceExtension = bVar5;
  }
  psVar2 = CreateSafeUniqueObjectFileName(this,&objectName,dir_max);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  std::__cxx11::string::~string((string *)&objectName);
  std::__cxx11::string::~string((string *)&relFromBinary);
  std::__cxx11::string::~string((string *)&relFromSource);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource = this->MaybeConvertToRelativePath(
    this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource);
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary = this->MaybeConvertToRelativePath(
    this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary);
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource)) {
    objectName = relFromBinary;
  } else if (relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName)) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        std::string repVar = "CMAKE_";
        repVar += lang;
        repVar += "_OUTPUT_EXTENSION_REPLACE";
        replaceExt = this->Makefile->IsOn(repVar);
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}